

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_CryptoPro_C_ParamSet.c
# Opt level: O0

void fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(uint64_t *out1,uint64_t *arg1,uint64_t *arg2)

{
  uint64_t *in_RDX;
  uint64_t *in_RSI;
  uint64_t *in_RDI;
  uint64_t x219;
  uint64_t x218;
  uint64_t x217;
  uint64_t x216;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x215;
  uint64_t x214;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x213;
  uint64_t x212;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x211;
  uint64_t x210;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x209;
  uint64_t x208;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x207;
  uint64_t x206;
  uint64_t x205;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x204;
  uint64_t x203;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x202;
  uint64_t x201;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x200;
  uint64_t x199;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x198;
  uint64_t x197;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x196;
  uint64_t x195;
  uint64_t x194;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x193;
  uint64_t x192;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x191;
  uint64_t x190;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x189;
  uint64_t x188;
  uint64_t x187;
  uint64_t x186;
  uint64_t x185;
  uint64_t x184;
  uint64_t x183;
  uint64_t x182;
  uint64_t x181;
  uint64_t x180;
  uint64_t x179;
  uint64_t x178;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x177;
  uint64_t x176;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x175;
  uint64_t x174;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x173;
  uint64_t x172;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x171;
  uint64_t x170;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x169;
  uint64_t x168;
  uint64_t x167;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x166;
  uint64_t x165;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x164;
  uint64_t x163;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x162;
  uint64_t x161;
  uint64_t x160;
  uint64_t x159;
  uint64_t x158;
  uint64_t x157;
  uint64_t x156;
  uint64_t x155;
  uint64_t x154;
  uint64_t x153;
  uint64_t x152;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x151;
  uint64_t x150;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x149;
  uint64_t x148;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x147;
  uint64_t x146;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x145;
  uint64_t x144;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x143;
  uint64_t x142;
  uint64_t x141;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x140;
  uint64_t x139;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x138;
  uint64_t x137;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x136;
  uint64_t x135;
  uint64_t x134;
  uint64_t x133;
  uint64_t x132;
  uint64_t x131;
  uint64_t x130;
  uint64_t x129;
  uint64_t x128;
  uint64_t x127;
  uint64_t x126;
  uint64_t x125;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x124;
  uint64_t x123;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x122;
  uint64_t x121;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x120;
  uint64_t x119;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x118;
  uint64_t x117;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x116;
  uint64_t x115;
  uint64_t x114;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x113;
  uint64_t x112;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x111;
  uint64_t x110;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x109;
  uint64_t x108;
  uint64_t x107;
  uint64_t x106;
  uint64_t x105;
  uint64_t x104;
  uint64_t x103;
  uint64_t x102;
  uint64_t x101;
  uint64_t x100;
  uint64_t x99;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x98;
  uint64_t x97;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x96;
  uint64_t x95;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x94;
  uint64_t x93;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x92;
  uint64_t x91;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x90;
  uint64_t x89;
  uint64_t x88;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x87;
  uint64_t x86;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x85;
  uint64_t x84;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x83;
  uint64_t x82;
  uint64_t x81;
  uint64_t x80;
  uint64_t x79;
  uint64_t x78;
  uint64_t x77;
  uint64_t x76;
  uint64_t x75;
  uint64_t x74;
  uint64_t x73;
  uint64_t x72;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x71;
  uint64_t x70;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x69;
  uint64_t x68;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x67;
  uint64_t x66;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x65;
  uint64_t x64;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x63;
  uint64_t x62;
  uint64_t x61;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x60;
  uint64_t x59;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x58;
  uint64_t x57;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x56;
  uint64_t x55;
  uint64_t x54;
  uint64_t x53;
  uint64_t x52;
  uint64_t x51;
  uint64_t x50;
  uint64_t x49;
  uint64_t x48;
  uint64_t x47;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x46;
  uint64_t x45;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x44;
  uint64_t x43;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x42;
  uint64_t x41;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x40;
  uint64_t x39;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x38;
  uint64_t x37;
  uint64_t x36;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x35;
  uint64_t x34;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x33;
  uint64_t x32;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x31;
  uint64_t x30;
  uint64_t x29;
  uint64_t x28;
  uint64_t x27;
  uint64_t x26;
  uint64_t x25;
  uint64_t x24;
  uint64_t x23;
  uint64_t x22;
  uint64_t x21;
  uint64_t x20;
  uint64_t x19;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x18;
  uint64_t x17;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x16;
  uint64_t x15;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x14;
  uint64_t x13;
  uint64_t x12;
  uint64_t x11;
  uint64_t x10;
  uint64_t x9;
  uint64_t x8;
  uint64_t x7;
  uint64_t x6;
  uint64_t x5;
  uint64_t x4;
  uint64_t x3;
  uint64_t x2;
  uint64_t x1;
  uint64_t local_6f0;
  uint64_t local_6e8;
  uint64_t local_6e0;
  uint64_t in_stack_fffffffffffff928;
  uint64_t in_stack_fffffffffffff930;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 in_stack_fffffffffffff93f;
  undefined7 in_stack_fffffffffffff940;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 in_stack_fffffffffffff947;
  uint64_t local_6b8;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_6a9;
  uint64_t local_6a8;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_699;
  uint64_t local_698;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_689;
  uint64_t local_688;
  uint64_t local_680;
  byte local_671;
  uint64_t local_670;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_661;
  uint64_t local_660;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_651;
  uint64_t local_650;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_641;
  uint64_t local_640;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_631;
  uint64_t local_630;
  uint64_t local_628;
  byte local_619;
  uint64_t local_618;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_609;
  uint64_t local_608;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_5f9;
  uint64_t local_5f8;
  uint64_t local_5f0;
  uint64_t local_5e8;
  uint64_t local_5e0;
  uint64_t local_5d8;
  uint64_t local_5d0;
  uint64_t local_5c8;
  uint64_t local_5c0;
  uint64_t local_5b8;
  uint64_t local_5b0;
  uint64_t local_5a8;
  byte local_599;
  uint64_t local_598;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_589;
  uint64_t local_588;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_579;
  uint64_t local_578;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_569;
  uint64_t local_568;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_559;
  uint64_t local_558;
  uint64_t local_550;
  byte local_541;
  uint64_t local_540;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_531;
  uint64_t local_530;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_521;
  uint64_t local_520;
  uint64_t local_518;
  uint64_t local_510;
  uint64_t local_508;
  uint64_t local_500;
  uint64_t local_4f8;
  uint64_t local_4f0;
  uint64_t local_4e8;
  uint64_t local_4e0;
  uint64_t local_4d8;
  byte local_4c9;
  uint64_t local_4c8;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_4b9;
  uint64_t local_4b8;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_4a9;
  uint64_t local_4a8;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_499;
  uint64_t local_498;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_489;
  uint64_t local_488;
  uint64_t local_480;
  byte local_471;
  uint64_t local_470;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_461;
  uint64_t local_460;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_451;
  uint64_t local_450;
  uint64_t local_448;
  uint64_t local_440;
  uint64_t local_438;
  uint64_t local_430;
  uint64_t local_428;
  uint64_t local_420;
  uint64_t local_418;
  uint64_t local_410;
  uint64_t local_408;
  uint64_t local_400;
  byte local_3f1;
  uint64_t local_3f0;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_3e1;
  uint64_t local_3e0;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_3d1;
  uint64_t local_3d0;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_3c1;
  uint64_t local_3c0;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_3b1;
  uint64_t local_3b0;
  uint64_t local_3a8;
  byte local_399;
  uint64_t local_398;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_389;
  uint64_t local_388;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_379;
  uint64_t local_378;
  uint64_t local_370;
  uint64_t local_368;
  uint64_t local_360;
  uint64_t local_358;
  uint64_t local_350;
  uint64_t local_348;
  uint64_t local_340;
  uint64_t local_338;
  uint64_t local_330;
  byte local_321;
  uint64_t local_320;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_311;
  uint64_t local_310;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_301;
  uint64_t local_300;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_2f1;
  uint64_t local_2f0;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_2e1;
  uint64_t local_2e0;
  uint64_t local_2d8;
  byte local_2c9;
  uint64_t local_2c8;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_2b9;
  uint64_t local_2b8;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_2a9;
  uint64_t local_2a8;
  uint64_t local_2a0;
  uint64_t local_298;
  uint64_t local_290;
  uint64_t local_288;
  uint64_t local_280;
  uint64_t local_278;
  uint64_t local_270;
  uint64_t local_268;
  uint64_t local_260;
  uint64_t local_258;
  byte local_249;
  uint64_t local_248;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_239;
  uint64_t local_238;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_229;
  uint64_t local_228;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_219;
  uint64_t local_218;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_209;
  uint64_t local_208;
  uint64_t local_200;
  byte local_1f1;
  uint64_t local_1f0;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_1e1;
  uint64_t local_1e0;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_1d1;
  uint64_t local_1d0;
  uint64_t local_1c8;
  uint64_t local_1c0;
  uint64_t local_1b8;
  uint64_t local_1b0;
  uint64_t local_1a8;
  uint64_t local_1a0;
  uint64_t local_198;
  uint64_t local_190;
  byte local_181;
  uint64_t local_180;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_171;
  uint64_t local_170;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_161;
  uint64_t local_160;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_151;
  uint64_t local_150;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_141;
  uint64_t local_140;
  uint64_t local_138;
  byte local_129;
  uint64_t local_128;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_119;
  uint64_t local_118;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_109;
  uint64_t local_108;
  uint64_t local_100;
  uint64_t local_f8;
  uint64_t local_f0;
  uint64_t local_e8;
  uint64_t local_e0;
  uint64_t local_d8;
  uint64_t local_d0;
  uint64_t local_c8;
  uint64_t local_c0;
  uint64_t local_b8;
  uint64_t local_b0;
  byte local_a1;
  uint64_t local_a0;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_91;
  uint64_t local_90;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 local_81;
  uint64_t local_80;
  uint64_t local_78;
  uint64_t local_70;
  uint64_t local_68;
  uint64_t local_60;
  uint64_t local_58;
  uint64_t local_50;
  uint64_t local_48;
  uint64_t local_40;
  uint64_t local_38;
  uint64_t local_30;
  uint64_t local_28;
  uint64_t local_20;
  uint64_t *local_18;
  uint64_t *local_8;
  
  local_20 = in_RSI[1];
  local_28 = in_RSI[2];
  local_30 = in_RSI[3];
  local_38 = *in_RSI;
  local_18 = in_RDX;
  local_8 = in_RDI;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&local_40,&local_48,local_38,in_RDX[3]);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&local_50,&local_58,local_38,local_18[2]);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&local_60,&local_68,local_38,local_18[1]);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&local_70,&local_78,local_38,*local_18);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_80,&local_81,'\0',local_78,local_60);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_90,&local_91,local_81,local_68,local_50);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_a0,&local_a1,local_91,local_58,local_40);
  local_b0 = local_a1 + local_48;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_b8,&local_c0,local_70,0xdf6e6c2c727c176d);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_c8,&local_d0,local_b8,0x9b9f605f5a858107);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_d8,&local_e0,local_b8,0xab1ec85e6b41c8aa);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_e8,&local_f0,local_b8,0xcf846e86789051d3);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_f8,&local_100,local_b8,0x7998f7b9022d759b);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_108,&local_109,'\0',local_100,local_e8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_118,&local_119,local_109,local_f0,local_d8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_128,&local_129,local_119,local_e0,local_c8);
  local_138 = local_129 + local_d0;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_140,&local_141,'\0',local_70,local_f8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_150,&local_151,local_141,local_80,local_108);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_160,&local_161,local_151,local_90,local_118);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_170,&local_171,local_161,local_a0,local_128);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_180,&local_181,local_171,local_b0,local_138);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&local_190,&local_198,local_20,local_18[3]);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&local_1a0,&local_1a8,local_20,local_18[2]);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&local_1b0,&local_1b8,local_20,local_18[1]);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&local_1c0,&local_1c8,local_20,*local_18);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_1d0,&local_1d1,'\0',local_1c8,local_1b0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_1e0,&local_1e1,local_1d1,local_1b8,local_1a0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_1f0,&local_1f1,local_1e1,local_1a8,local_190);
  local_200 = local_1f1 + local_198;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_208,&local_209,'\0',local_150,local_1c0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_218,&local_219,local_209,local_160,local_1d0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_228,&local_229,local_219,local_170,local_1e0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_238,&local_239,local_229,local_180,local_1f0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_248,&local_249,local_239,(ulong)local_181,local_200);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_258,&local_260,local_208,0xdf6e6c2c727c176d);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_268,&local_270,local_258,0x9b9f605f5a858107);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_278,&local_280,local_258,0xab1ec85e6b41c8aa);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_288,&local_290,local_258,0xcf846e86789051d3);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_298,&local_2a0,local_258,0x7998f7b9022d759b);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_2a8,&local_2a9,'\0',local_2a0,local_288);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_2b8,&local_2b9,local_2a9,local_290,local_278);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_2c8,&local_2c9,local_2b9,local_280,local_268);
  local_2d8 = local_2c9 + local_270;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_2e0,&local_2e1,'\0',local_208,local_298);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_2f0,&local_2f1,local_2e1,local_218,local_2a8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_300,&local_301,local_2f1,local_228,local_2b8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_310,&local_311,local_301,local_238,local_2c8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_320,&local_321,local_311,local_248,local_2d8);
  local_330 = (ulong)local_321 + (ulong)local_249;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&local_338,&local_340,local_28,local_18[3]);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&local_348,&local_350,local_28,local_18[2]);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&local_358,&local_360,local_28,local_18[1]);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&local_368,&local_370,local_28,*local_18);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_378,&local_379,'\0',local_370,local_358);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_388,&local_389,local_379,local_360,local_348);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_398,&local_399,local_389,local_350,local_338);
  local_3a8 = local_399 + local_340;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_3b0,&local_3b1,'\0',local_2f0,local_368);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_3c0,&local_3c1,local_3b1,local_300,local_378);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_3d0,&local_3d1,local_3c1,local_310,local_388);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_3e0,&local_3e1,local_3d1,local_320,local_398);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_3f0,&local_3f1,local_3e1,local_330,local_3a8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_400,&local_408,local_3b0,0xdf6e6c2c727c176d);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_410,&local_418,local_400,0x9b9f605f5a858107);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_420,&local_428,local_400,0xab1ec85e6b41c8aa);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_430,&local_438,local_400,0xcf846e86789051d3);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_440,&local_448,local_400,0x7998f7b9022d759b);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_450,&local_451,'\0',local_448,local_430);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_460,&local_461,local_451,local_438,local_420);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_470,&local_471,local_461,local_428,local_410);
  local_480 = local_471 + local_418;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_488,&local_489,'\0',local_3b0,local_440);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_498,&local_499,local_489,local_3c0,local_450);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_4a8,&local_4a9,local_499,local_3d0,local_460);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_4b8,&local_4b9,local_4a9,local_3e0,local_470);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_4c8,&local_4c9,local_4b9,local_3f0,local_480);
  local_4d8 = (ulong)local_4c9 + (ulong)local_3f1;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&local_4e0,&local_4e8,local_30,local_18[3]);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&local_4f0,&local_4f8,local_30,local_18[2]);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&local_500,&local_508,local_30,local_18[1]);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&local_510,&local_518,local_30,*local_18);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_520,&local_521,'\0',local_518,local_500);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_530,&local_531,local_521,local_508,local_4f0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_540,&local_541,local_531,local_4f8,local_4e0);
  local_550 = local_541 + local_4e8;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_558,&local_559,'\0',local_498,local_510);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_568,&local_569,local_559,local_4a8,local_520);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_578,&local_579,local_569,local_4b8,local_530);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_588,&local_589,local_579,local_4c8,local_540);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_598,&local_599,local_589,local_4d8,local_550);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_5a8,&local_5b0,local_558,0xdf6e6c2c727c176d);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_5b8,&local_5c0,local_5a8,0x9b9f605f5a858107);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_5c8,&local_5d0,local_5a8,0xab1ec85e6b41c8aa);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_5d8,&local_5e0,local_5a8,0xcf846e86789051d3);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64
            (&local_5e8,&local_5f0,local_5a8,0x7998f7b9022d759b);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_5f8,&local_5f9,'\0',local_5f0,local_5d8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_608,&local_609,local_5f9,local_5e0,local_5c8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_618,&local_619,local_609,local_5d0,local_5b8);
  local_628 = local_619 + local_5c0;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_630,&local_631,'\0',local_558,local_5e8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_640,&local_641,local_631,local_568,local_5f8);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_650,&local_651,local_641,local_578,local_608);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_660,&local_661,local_651,local_588,local_618);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64
            (&local_670,&local_671,local_661,local_598,local_628);
  local_680 = (ulong)local_671 + (ulong)local_599;
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64
            (&local_688,&local_689,'\0',local_640,0x7998f7b9022d759b);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64
            (&local_698,&local_699,local_689,local_650,0xcf846e86789051d3);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64
            (&local_6a8,&local_6a9,local_699,local_660,0xab1ec85e6b41c8aa);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64
            (&local_6b8,&stack0xfffffffffffff947,local_6a9,local_670,0x9b9f605f5a858107);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64
            ((uint64_t *)&stack0xfffffffffffff938,&stack0xfffffffffffff937,in_stack_fffffffffffff947
             ,local_680,0);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64
            ((uint64_t *)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
             in_stack_fffffffffffff93f,in_stack_fffffffffffff930,in_stack_fffffffffffff928);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64
            ((uint64_t *)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
             in_stack_fffffffffffff93f,in_stack_fffffffffffff930,in_stack_fffffffffffff928);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64
            ((uint64_t *)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
             in_stack_fffffffffffff93f,in_stack_fffffffffffff930,in_stack_fffffffffffff928);
  fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64
            ((uint64_t *)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
             in_stack_fffffffffffff93f,in_stack_fffffffffffff930,in_stack_fffffffffffff928);
  *local_8 = in_stack_fffffffffffff928;
  local_8[1] = local_6e0;
  local_8[2] = local_6e8;
  local_8[3] = local_6f0;
  return;
}

Assistant:

static void fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mul(
    uint64_t out1[4], const uint64_t arg1[4], const uint64_t arg2[4]) {
    uint64_t x1;
    uint64_t x2;
    uint64_t x3;
    uint64_t x4;
    uint64_t x5;
    uint64_t x6;
    uint64_t x7;
    uint64_t x8;
    uint64_t x9;
    uint64_t x10;
    uint64_t x11;
    uint64_t x12;
    uint64_t x13;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x14;
    uint64_t x15;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x16;
    uint64_t x17;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x18;
    uint64_t x19;
    uint64_t x20;
    uint64_t x21;
    uint64_t x22;
    uint64_t x23;
    uint64_t x24;
    uint64_t x25;
    uint64_t x26;
    uint64_t x27;
    uint64_t x28;
    uint64_t x29;
    uint64_t x30;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x31;
    uint64_t x32;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x33;
    uint64_t x34;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x35;
    uint64_t x36;
    uint64_t x37;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x38;
    uint64_t x39;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x40;
    uint64_t x41;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x42;
    uint64_t x43;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x44;
    uint64_t x45;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x46;
    uint64_t x47;
    uint64_t x48;
    uint64_t x49;
    uint64_t x50;
    uint64_t x51;
    uint64_t x52;
    uint64_t x53;
    uint64_t x54;
    uint64_t x55;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x56;
    uint64_t x57;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x58;
    uint64_t x59;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x60;
    uint64_t x61;
    uint64_t x62;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x63;
    uint64_t x64;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x65;
    uint64_t x66;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x67;
    uint64_t x68;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x69;
    uint64_t x70;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x71;
    uint64_t x72;
    uint64_t x73;
    uint64_t x74;
    uint64_t x75;
    uint64_t x76;
    uint64_t x77;
    uint64_t x78;
    uint64_t x79;
    uint64_t x80;
    uint64_t x81;
    uint64_t x82;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x83;
    uint64_t x84;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x85;
    uint64_t x86;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x87;
    uint64_t x88;
    uint64_t x89;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x90;
    uint64_t x91;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x92;
    uint64_t x93;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x94;
    uint64_t x95;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x96;
    uint64_t x97;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x98;
    uint64_t x99;
    uint64_t x100;
    uint64_t x101;
    uint64_t x102;
    uint64_t x103;
    uint64_t x104;
    uint64_t x105;
    uint64_t x106;
    uint64_t x107;
    uint64_t x108;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x109;
    uint64_t x110;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x111;
    uint64_t x112;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x113;
    uint64_t x114;
    uint64_t x115;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x116;
    uint64_t x117;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x118;
    uint64_t x119;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x120;
    uint64_t x121;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x122;
    uint64_t x123;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x124;
    uint64_t x125;
    uint64_t x126;
    uint64_t x127;
    uint64_t x128;
    uint64_t x129;
    uint64_t x130;
    uint64_t x131;
    uint64_t x132;
    uint64_t x133;
    uint64_t x134;
    uint64_t x135;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x136;
    uint64_t x137;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x138;
    uint64_t x139;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x140;
    uint64_t x141;
    uint64_t x142;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x143;
    uint64_t x144;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x145;
    uint64_t x146;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x147;
    uint64_t x148;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x149;
    uint64_t x150;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x151;
    uint64_t x152;
    uint64_t x153;
    uint64_t x154;
    uint64_t x155;
    uint64_t x156;
    uint64_t x157;
    uint64_t x158;
    uint64_t x159;
    uint64_t x160;
    uint64_t x161;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x162;
    uint64_t x163;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x164;
    uint64_t x165;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x166;
    uint64_t x167;
    uint64_t x168;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x169;
    uint64_t x170;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x171;
    uint64_t x172;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x173;
    uint64_t x174;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x175;
    uint64_t x176;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x177;
    uint64_t x178;
    uint64_t x179;
    uint64_t x180;
    uint64_t x181;
    uint64_t x182;
    uint64_t x183;
    uint64_t x184;
    uint64_t x185;
    uint64_t x186;
    uint64_t x187;
    uint64_t x188;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x189;
    uint64_t x190;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x191;
    uint64_t x192;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x193;
    uint64_t x194;
    uint64_t x195;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x196;
    uint64_t x197;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x198;
    uint64_t x199;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x200;
    uint64_t x201;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x202;
    uint64_t x203;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x204;
    uint64_t x205;
    uint64_t x206;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x207;
    uint64_t x208;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x209;
    uint64_t x210;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x211;
    uint64_t x212;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x213;
    uint64_t x214;
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_uint1 x215;
    uint64_t x216;
    uint64_t x217;
    uint64_t x218;
    uint64_t x219;
    x1 = (arg1[1]);
    x2 = (arg1[2]);
    x3 = (arg1[3]);
    x4 = (arg1[0]);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x5, &x6, x4,
                                                         (arg2[3]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x7, &x8, x4,
                                                         (arg2[2]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x9, &x10, x4,
                                                         (arg2[1]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x11, &x12, x4,
                                                         (arg2[0]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x13, &x14, 0x0,
                                                              x12, x9);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x15, &x16, x14,
                                                              x10, x7);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x17, &x18, x16,
                                                              x8, x5);
    x19 = (x18 + x6);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x20, &x21, x11, UINT64_C(0xdf6e6c2c727c176d));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x22, &x23, x20, UINT64_C(0x9b9f605f5a858107));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x24, &x25, x20, UINT64_C(0xab1ec85e6b41c8aa));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x26, &x27, x20, UINT64_C(0xcf846e86789051d3));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x28, &x29, x20, UINT64_C(0x7998f7b9022d759b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x30, &x31, 0x0,
                                                              x29, x26);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x32, &x33, x31,
                                                              x27, x24);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x34, &x35, x33,
                                                              x25, x22);
    x36 = (x35 + x23);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x37, &x38, 0x0,
                                                              x11, x28);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x39, &x40, x38,
                                                              x13, x30);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x41, &x42, x40,
                                                              x15, x32);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x43, &x44, x42,
                                                              x17, x34);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x45, &x46, x44,
                                                              x19, x36);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x47, &x48, x1,
                                                         (arg2[3]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x49, &x50, x1,
                                                         (arg2[2]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x51, &x52, x1,
                                                         (arg2[1]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x53, &x54, x1,
                                                         (arg2[0]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x55, &x56, 0x0,
                                                              x54, x51);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x57, &x58, x56,
                                                              x52, x49);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x59, &x60, x58,
                                                              x50, x47);
    x61 = (x60 + x48);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x62, &x63, 0x0,
                                                              x39, x53);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x64, &x65, x63,
                                                              x41, x55);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x66, &x67, x65,
                                                              x43, x57);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x68, &x69, x67,
                                                              x45, x59);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x70, &x71, x69,
                                                              x46, x61);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x72, &x73, x62, UINT64_C(0xdf6e6c2c727c176d));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x74, &x75, x72, UINT64_C(0x9b9f605f5a858107));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x76, &x77, x72, UINT64_C(0xab1ec85e6b41c8aa));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x78, &x79, x72, UINT64_C(0xcf846e86789051d3));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x80, &x81, x72, UINT64_C(0x7998f7b9022d759b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x82, &x83, 0x0,
                                                              x81, x78);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x84, &x85, x83,
                                                              x79, x76);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x86, &x87, x85,
                                                              x77, x74);
    x88 = (x87 + x75);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x89, &x90, 0x0,
                                                              x62, x80);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x91, &x92, x90,
                                                              x64, x82);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x93, &x94, x92,
                                                              x66, x84);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x95, &x96, x94,
                                                              x68, x86);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x97, &x98, x96,
                                                              x70, x88);
    x99 = ((uint64_t)x98 + x71);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x100, &x101, x2,
                                                         (arg2[3]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x102, &x103, x2,
                                                         (arg2[2]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x104, &x105, x2,
                                                         (arg2[1]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x106, &x107, x2,
                                                         (arg2[0]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x108, &x109, 0x0,
                                                              x107, x104);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x110, &x111,
                                                              x109, x105, x102);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x112, &x113,
                                                              x111, x103, x100);
    x114 = (x113 + x101);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x115, &x116, 0x0,
                                                              x91, x106);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x117, &x118,
                                                              x116, x93, x108);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x119, &x120,
                                                              x118, x95, x110);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x121, &x122,
                                                              x120, x97, x112);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x123, &x124,
                                                              x122, x99, x114);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x125, &x126, x115, UINT64_C(0xdf6e6c2c727c176d));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x127, &x128, x125, UINT64_C(0x9b9f605f5a858107));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x129, &x130, x125, UINT64_C(0xab1ec85e6b41c8aa));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x131, &x132, x125, UINT64_C(0xcf846e86789051d3));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x133, &x134, x125, UINT64_C(0x7998f7b9022d759b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x135, &x136, 0x0,
                                                              x134, x131);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x137, &x138,
                                                              x136, x132, x129);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x139, &x140,
                                                              x138, x130, x127);
    x141 = (x140 + x128);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x142, &x143, 0x0,
                                                              x115, x133);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x144, &x145,
                                                              x143, x117, x135);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x146, &x147,
                                                              x145, x119, x137);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x148, &x149,
                                                              x147, x121, x139);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x150, &x151,
                                                              x149, x123, x141);
    x152 = ((uint64_t)x151 + x124);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x153, &x154, x3,
                                                         (arg2[3]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x155, &x156, x3,
                                                         (arg2[2]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x157, &x158, x3,
                                                         (arg2[1]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(&x159, &x160, x3,
                                                         (arg2[0]));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x161, &x162, 0x0,
                                                              x160, x157);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x163, &x164,
                                                              x162, x158, x155);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x165, &x166,
                                                              x164, x156, x153);
    x167 = (x166 + x154);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x168, &x169, 0x0,
                                                              x144, x159);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x170, &x171,
                                                              x169, x146, x161);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x172, &x173,
                                                              x171, x148, x163);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x174, &x175,
                                                              x173, x150, x165);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x176, &x177,
                                                              x175, x152, x167);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x178, &x179, x168, UINT64_C(0xdf6e6c2c727c176d));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x180, &x181, x178, UINT64_C(0x9b9f605f5a858107));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x182, &x183, x178, UINT64_C(0xab1ec85e6b41c8aa));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x184, &x185, x178, UINT64_C(0xcf846e86789051d3));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_mulx_u64(
        &x186, &x187, x178, UINT64_C(0x7998f7b9022d759b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x188, &x189, 0x0,
                                                              x187, x184);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x190, &x191,
                                                              x189, x185, x182);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x192, &x193,
                                                              x191, x183, x180);
    x194 = (x193 + x181);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x195, &x196, 0x0,
                                                              x168, x186);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x197, &x198,
                                                              x196, x170, x188);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x199, &x200,
                                                              x198, x172, x190);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x201, &x202,
                                                              x200, x174, x192);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_addcarryx_u64(&x203, &x204,
                                                              x202, x176, x194);
    x205 = ((uint64_t)x204 + x177);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(
        &x206, &x207, 0x0, x197, UINT64_C(0x7998f7b9022d759b));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(
        &x208, &x209, x207, x199, UINT64_C(0xcf846e86789051d3));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(
        &x210, &x211, x209, x201, UINT64_C(0xab1ec85e6b41c8aa));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(
        &x212, &x213, x211, x203, UINT64_C(0x9b9f605f5a858107));
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_subborrowx_u64(&x214, &x215,
                                                               x213, x205, 0x0);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64(&x216, x215, x206,
                                                            x197);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64(&x217, x215, x208,
                                                            x199);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64(&x218, x215, x210,
                                                            x201);
    fiat_id_GostR3410_2001_CryptoPro_C_ParamSet_cmovznz_u64(&x219, x215, x212,
                                                            x203);
    out1[0] = x216;
    out1[1] = x217;
    out1[2] = x218;
    out1[3] = x219;
}